

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void ggml_vec_scale_f32(int n,float *y,float v)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  float *pfVar4;
  long lVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 in_register_00001204 [12];
  
  auVar1._4_12_ = in_register_00001204;
  auVar1._0_4_ = v;
  auVar6 = vbroadcastss_avx512f(auVar1);
  lVar2 = (long)(int)(n & 0xffffffc0);
  pfVar4 = y;
  for (lVar3 = 0; lVar3 < lVar2; lVar3 = lVar3 + 0x40) {
    for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 0x40) {
      auVar7 = vmulps_avx512f(auVar6,*(undefined1 (*) [64])((long)pfVar4 + lVar5));
      *(undefined1 (*) [64])((long)pfVar4 + lVar5) = auVar7;
    }
    pfVar4 = pfVar4 + 0x40;
  }
  for (; lVar2 < n; lVar2 = lVar2 + 1) {
    y[lVar2] = v * y[lVar2];
  }
  return;
}

Assistant:

inline static void ggml_vec_scale_f32(const int n, float * y, const float   v) {
#if defined(GGML_USE_ACCELERATE)
    vDSP_vsmul(y, 1, &v, y, 1, n);
#elif defined(GGML_SIMD)
    const int np = (n & ~(GGML_F32_STEP - 1));

    GGML_F32_VEC vx = GGML_F32_VEC_SET1(v);

    GGML_F32_VEC ay[GGML_F32_ARR];

    for (int i = 0; i < np; i += GGML_F32_STEP) {
        for (int j = 0; j < GGML_F32_ARR; j++) {
            ay[j] = GGML_F32_VEC_LOAD(y + i + j*GGML_F32_EPR);
            ay[j] = GGML_F32_VEC_MUL(ay[j], vx);

            GGML_F32_VEC_STORE(y + i + j*GGML_F32_EPR, ay[j]);
        }
    }

    // leftovers
    for (int i = np; i < n; ++i) {
        y[i] *= v;
    }
#else
    // scalar
    for (int i = 0; i < n; ++i) {
        y[i] *= v;
    }
#endif
}